

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void ImGui::RenderArrowDockMenu(ImDrawList *draw_list,ImVec2 p_min,float sz,ImU32 col)

{
  ImVec2 pos;
  ImVec2 half_sz;
  float fVar1;
  float fVar2;
  ImVec2 local_20;
  ImVec2 local_18;
  
  fVar1 = p_min.x;
  fVar2 = p_min.y;
  local_18.x = sz * 0.2 + fVar1;
  local_18.y = sz * 0.15 + fVar2;
  local_20.y = sz * 0.3 + fVar2;
  local_20.x = sz * 0.8 + fVar1;
  ImDrawList::AddRectFilled(draw_list,&local_18,&local_20,col,0.0,0);
  pos.y = sz * 0.85 + fVar2;
  pos.x = sz * 0.5 + fVar1;
  half_sz.y = sz * 0.4;
  half_sz.x = sz * 0.3;
  RenderArrowPointingAt(draw_list,pos,half_sz,3,col);
  return;
}

Assistant:

void ImGui::RenderArrowDockMenu(ImDrawList* draw_list, ImVec2 p_min, float sz, ImU32 col)
{
    draw_list->AddRectFilled(p_min + ImVec2(sz * 0.20f, sz * 0.15f), p_min + ImVec2(sz * 0.80f, sz * 0.30f), col);
    RenderArrowPointingAt(draw_list, p_min + ImVec2(sz * 0.50f, sz * 0.85f), ImVec2(sz * 0.30f, sz * 0.40f), ImGuiDir_Down, col);
}